

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_op.hpp
# Opt level: O2

want __thiscall
asio::ssl::detail::write_op<asio::const_buffers_1>::operator()
          (write_op<asio::const_buffers_1> *this,engine *eng,error_code *ec,
          size_t *bytes_transferred)

{
  ssize_t sVar1;
  const_buffer buffer;
  void *local_10;
  size_t sStack_8;
  
  local_10 = (this->buffers_).super_const_buffer.data_;
  sStack_8 = (this->buffers_).super_const_buffer.size_;
  sVar1 = engine::write(eng,(int)&local_10,ec,(size_t)bytes_transferred);
  return (want)sVar1;
}

Assistant:

engine::want operator()(engine& eng,
      asio::error_code& ec,
      std::size_t& bytes_transferred) const
  {
    unsigned char storage[
      asio::detail::buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence>::linearisation_storage_size];

    asio::const_buffer buffer =
      asio::detail::buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence>::linearise(buffers_, asio::buffer(storage));

    return eng.write(buffer, ec, bytes_transferred);
  }